

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::WriteFrame
          (h__Writer *this,FrameBuffer *frame_buf,AESEncContext *Ctx,HMACContext *HMAC)

{
  ILogSink *this_00;
  
  if (*(int *)(Ctx + 0x18) == 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"The frame buffer size is zero.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if (*(int *)(frame_buf + 0x370) == 2) {
      ASDCP::MXF::h__WriterState::Goto_RUNNING((h__WriterState *)&stack0xffffffffffffff70);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
    }
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      if (*(long *)(frame_buf + 0x5b0) == 0) {
        h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::StartClip
                  ((h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR> *)&stack0xffffffffffffff70,
                   (byte_t *)frame_buf,(AESEncContext *)(frame_buf + 0x5c8),HMAC);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
        if (*(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                     super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                     super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter < 0) {
          return this;
        }
      }
      h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::WriteClipBlock
                ((h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR> *)&stack0xffffffffffffff70,
                 frame_buf);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
      if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                        super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                        super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
        *(uint *)(frame_buf + 0x338) =
             *(int *)(frame_buf + 0x338) + *(uint *)(Ctx + 0x18) / *(uint *)(frame_buf + 0x5d8);
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::WriteFrame(const FrameBuffer& frame_buf, AESEncContext* Ctx,
					     HMACContext* HMAC)
{
  if ( frame_buf.Size() == 0 )
    {
      DefaultLogSink().Error("The frame buffer size is zero.\n");
      return RESULT_PARAM;
    }

  Result_t result = RESULT_OK;

  if ( m_State.Test_READY() )
    {
      result = m_State.Goto_RUNNING(); // first time through
    }

  if ( KM_SUCCESS(result) && ! HasOpenClip() )
    {
      result = StartClip(m_EssenceUL, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      result = WriteClipBlock(frame_buf);
    }

  if ( KM_SUCCESS(result) )
    {
      m_FramesWritten += frame_buf.Size() / m_BytesPerSample;
    }

  return result;
}